

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::PReLU_x86_avx::forward_inplace(PReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [32];
  uint uVar6;
  float *pfVar7;
  _func_int **pp_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  ulong uVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  undefined1 (*pauVar18) [32];
  undefined1 (*pauVar19) [16];
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar28;
  float fVar29;
  undefined1 auVar25 [16];
  float fVar30;
  undefined1 auVar26 [28];
  undefined1 auVar27 [28];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  auVar9 = _DAT_0031a320;
  auVar5 = _DAT_0031a300;
  iVar14 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar14 == 3) {
      iVar14 = bottom_top_blob->c;
      if (0 < (long)iVar14) {
        iVar15 = bottom_top_blob->h * bottom_top_blob->w;
        pp_Var8 = this->_vptr_PReLU_x86_avx;
        lVar17 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var8[-3]) < 2) {
            fVar24 = **(float **)(&this->field_0xd8 + (long)pp_Var8[-3]);
            fVar28 = fVar24;
            fVar29 = fVar24;
            fVar30 = fVar24;
          }
          else {
            pfVar7 = *(float **)(&this->field_0xd8 + (long)pp_Var8[-3]) + lVar17 * 4;
            fVar24 = *pfVar7;
            fVar28 = pfVar7[1];
            fVar29 = pfVar7[2];
            fVar30 = pfVar7[3];
          }
          if (0 < iVar15) {
            pauVar19 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar20 = iVar15;
            do {
              auVar23 = vmaxps_avx(*pauVar19,ZEXT816(0) << 0x40);
              auVar25 = vminps_avx(*pauVar19,ZEXT816(0) << 0x40);
              auVar33._0_4_ = auVar25._0_4_ * fVar24 + auVar23._0_4_;
              auVar33._4_4_ = auVar25._4_4_ * fVar28 + auVar23._4_4_;
              auVar33._8_4_ = auVar25._8_4_ * fVar29 + auVar23._8_4_;
              auVar33._12_4_ = auVar25._12_4_ * fVar30 + auVar23._12_4_;
              *pauVar19 = auVar33;
              pauVar19 = pauVar19 + 1;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar14);
      }
    }
    else if (iVar14 == 2) {
      iVar14 = bottom_top_blob->h;
      if (0 < (long)iVar14) {
        iVar15 = bottom_top_blob->w;
        pp_Var8 = this->_vptr_PReLU_x86_avx;
        lVar17 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var8[-3]) < 2) {
            fVar24 = **(float **)(&this->field_0xd8 + (long)pp_Var8[-3]);
            fVar28 = fVar24;
            fVar29 = fVar24;
            fVar30 = fVar24;
          }
          else {
            pfVar7 = *(float **)(&this->field_0xd8 + (long)pp_Var8[-3]) + lVar17 * 4;
            fVar24 = *pfVar7;
            fVar28 = pfVar7[1];
            fVar29 = pfVar7[2];
            fVar30 = pfVar7[3];
          }
          if (0 < iVar15) {
            pauVar19 = (undefined1 (*) [16])
                       (bottom_top_blob->w * lVar17 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar20 = iVar15;
            do {
              auVar23 = vmaxps_avx(*pauVar19,ZEXT816(0) << 0x40);
              auVar25 = vminps_avx(*pauVar19,ZEXT816(0) << 0x40);
              auVar32._0_4_ = auVar25._0_4_ * fVar24 + auVar23._0_4_;
              auVar32._4_4_ = auVar25._4_4_ * fVar28 + auVar23._4_4_;
              auVar32._8_4_ = auVar25._8_4_ * fVar29 + auVar23._8_4_;
              auVar32._12_4_ = auVar25._12_4_ * fVar30 + auVar23._12_4_;
              *pauVar19 = auVar32;
              pauVar19 = pauVar19 + 1;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar14);
      }
    }
    else if (iVar14 == 1) {
      uVar6 = bottom_top_blob->w;
      pfVar7 = *(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx[-3]) < 2) {
        if (0 < (int)uVar6) {
          fVar24 = *pfVar7;
          lVar17 = 0;
          do {
            auVar23 = *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar17);
            auVar25 = vmaxps_avx(auVar23,ZEXT816(0));
            auVar23 = vminps_avx(auVar23,ZEXT816(0));
            auVar31._0_4_ = auVar23._0_4_ * fVar24 + auVar25._0_4_;
            auVar31._4_4_ = auVar23._4_4_ * fVar24 + auVar25._4_4_;
            auVar31._8_4_ = auVar23._8_4_ * fVar24 + auVar25._8_4_;
            auVar31._12_4_ = auVar23._12_4_ * fVar24 + auVar25._12_4_;
            *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar17) = auVar31;
            lVar17 = lVar17 + 0x10;
          } while ((ulong)uVar6 << 4 != lVar17);
        }
      }
      else if (0 < (int)uVar6) {
        lVar17 = 0;
        do {
          auVar23 = *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar17);
          auVar25 = vmaxps_avx(auVar23,ZEXT816(0));
          auVar23 = vminps_avx(auVar23,ZEXT816(0));
          pfVar1 = (float *)((long)pfVar7 + lVar17);
          fVar24 = pfVar1[1];
          fVar28 = pfVar1[2];
          fVar29 = pfVar1[3];
          pfVar2 = (float *)((long)bottom_top_blob->data + lVar17);
          *pfVar2 = auVar23._0_4_ * *pfVar1 + auVar25._0_4_;
          pfVar2[1] = auVar23._4_4_ * fVar24 + auVar25._4_4_;
          pfVar2[2] = auVar23._8_4_ * fVar28 + auVar25._8_4_;
          pfVar2[3] = auVar23._12_4_ * fVar29 + auVar25._12_4_;
          lVar17 = lVar17 + 0x10;
        } while ((ulong)uVar6 << 4 != lVar17);
      }
    }
  }
  else if (bottom_top_blob->elempack == 8) {
    if (iVar14 == 3) {
      iVar14 = bottom_top_blob->c;
      if (0 < (long)iVar14) {
        iVar15 = bottom_top_blob->h * bottom_top_blob->w;
        pp_Var8 = this->_vptr_PReLU_x86_avx;
        lVar17 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var8[-3]) < 2) {
            uVar4 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var8[-3]);
            auVar27._4_4_ = uVar4;
            auVar27._0_4_ = uVar4;
            auVar27._8_4_ = uVar4;
            auVar27._12_4_ = uVar4;
            auVar27._16_4_ = uVar4;
            auVar27._20_4_ = uVar4;
            auVar27._24_4_ = uVar4;
          }
          else {
            auVar27 = SUB3228(*(undefined1 (*) [32])
                               (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var8[-3]) + lVar17 * 8
                               ),0);
          }
          if (0 < iVar15) {
            pauVar18 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar17 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar20 = iVar15;
            do {
              auVar5 = vmaxps_avx(*pauVar18,ZEXT1632(ZEXT816(0) << 0x40));
              auVar9 = vminps_avx(*pauVar18,ZEXT1632(ZEXT816(0) << 0x40));
              auVar36._0_4_ = auVar9._0_4_ * auVar27._0_4_ + auVar5._0_4_;
              auVar36._4_4_ = auVar9._4_4_ * auVar27._4_4_ + auVar5._4_4_;
              auVar36._8_4_ = auVar9._8_4_ * auVar27._8_4_ + auVar5._8_4_;
              auVar36._12_4_ = auVar9._12_4_ * auVar27._12_4_ + auVar5._12_4_;
              auVar36._16_4_ = auVar9._16_4_ * auVar27._16_4_ + auVar5._16_4_;
              auVar36._20_4_ = auVar9._20_4_ * auVar27._20_4_ + auVar5._20_4_;
              auVar36._24_4_ = auVar9._24_4_ * auVar27._24_4_ + auVar5._24_4_;
              auVar36._28_4_ = auVar9._28_4_ + auVar5._28_4_;
              *pauVar18 = auVar36;
              pauVar18 = pauVar18 + 1;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar14);
      }
    }
    else if (iVar14 == 2) {
      iVar14 = bottom_top_blob->h;
      if (0 < (long)iVar14) {
        iVar15 = bottom_top_blob->w;
        pp_Var8 = this->_vptr_PReLU_x86_avx;
        lVar17 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var8[-3]) < 2) {
            uVar4 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var8[-3]);
            auVar26._4_4_ = uVar4;
            auVar26._0_4_ = uVar4;
            auVar26._8_4_ = uVar4;
            auVar26._12_4_ = uVar4;
            auVar26._16_4_ = uVar4;
            auVar26._20_4_ = uVar4;
            auVar26._24_4_ = uVar4;
          }
          else {
            auVar26 = SUB3228(*(undefined1 (*) [32])
                               (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var8[-3]) + lVar17 * 8
                               ),0);
          }
          if (0 < iVar15) {
            pauVar18 = (undefined1 (*) [32])
                       (bottom_top_blob->w * lVar17 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar20 = iVar15;
            do {
              auVar5 = vmaxps_avx(*pauVar18,ZEXT1632(ZEXT816(0) << 0x40));
              auVar9 = vminps_avx(*pauVar18,ZEXT1632(ZEXT816(0) << 0x40));
              auVar35._0_4_ = auVar9._0_4_ * auVar26._0_4_ + auVar5._0_4_;
              auVar35._4_4_ = auVar9._4_4_ * auVar26._4_4_ + auVar5._4_4_;
              auVar35._8_4_ = auVar9._8_4_ * auVar26._8_4_ + auVar5._8_4_;
              auVar35._12_4_ = auVar9._12_4_ * auVar26._12_4_ + auVar5._12_4_;
              auVar35._16_4_ = auVar9._16_4_ * auVar26._16_4_ + auVar5._16_4_;
              auVar35._20_4_ = auVar9._20_4_ * auVar26._20_4_ + auVar5._20_4_;
              auVar35._24_4_ = auVar9._24_4_ * auVar26._24_4_ + auVar5._24_4_;
              auVar35._28_4_ = auVar9._28_4_ + auVar5._28_4_;
              *pauVar18 = auVar35;
              pauVar18 = pauVar18 + 1;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar14);
      }
    }
    else if (iVar14 == 1) {
      uVar6 = bottom_top_blob->w;
      pfVar7 = *(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx[-3]) < 2) {
        if (0 < (int)uVar6) {
          fVar24 = *pfVar7;
          lVar17 = 0;
          do {
            auVar5 = *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar17);
            auVar9 = vmaxps_avx(auVar5,ZEXT1632(ZEXT816(0)));
            auVar5 = vminps_avx(auVar5,ZEXT1632(ZEXT816(0)));
            auVar34._0_4_ = auVar5._0_4_ * fVar24 + auVar9._0_4_;
            auVar34._4_4_ = auVar5._4_4_ * fVar24 + auVar9._4_4_;
            auVar34._8_4_ = auVar5._8_4_ * fVar24 + auVar9._8_4_;
            auVar34._12_4_ = auVar5._12_4_ * fVar24 + auVar9._12_4_;
            auVar34._16_4_ = auVar5._16_4_ * fVar24 + auVar9._16_4_;
            auVar34._20_4_ = auVar5._20_4_ * fVar24 + auVar9._20_4_;
            auVar34._24_4_ = auVar5._24_4_ * fVar24 + auVar9._24_4_;
            auVar34._28_4_ = auVar5._28_4_ + auVar9._28_4_;
            *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar17) = auVar34;
            lVar17 = lVar17 + 0x20;
          } while ((ulong)uVar6 << 5 != lVar17);
        }
      }
      else if (0 < (int)uVar6) {
        lVar17 = 0;
        do {
          auVar5 = *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar17);
          auVar9 = vmaxps_avx(auVar5,ZEXT1632(ZEXT816(0)));
          auVar5 = vminps_avx(auVar5,ZEXT1632(ZEXT816(0)));
          pfVar1 = (float *)((long)pfVar7 + lVar17);
          fVar24 = pfVar1[1];
          fVar28 = pfVar1[2];
          fVar29 = pfVar1[3];
          fVar30 = pfVar1[4];
          fVar12 = pfVar1[5];
          fVar13 = pfVar1[6];
          pfVar2 = (float *)((long)bottom_top_blob->data + lVar17);
          *pfVar2 = auVar5._0_4_ * *pfVar1 + auVar9._0_4_;
          pfVar2[1] = auVar5._4_4_ * fVar24 + auVar9._4_4_;
          pfVar2[2] = auVar5._8_4_ * fVar28 + auVar9._8_4_;
          pfVar2[3] = auVar5._12_4_ * fVar29 + auVar9._12_4_;
          pfVar2[4] = auVar5._16_4_ * fVar30 + auVar9._16_4_;
          pfVar2[5] = auVar5._20_4_ * fVar12 + auVar9._20_4_;
          pfVar2[6] = auVar5._24_4_ * fVar13 + auVar9._24_4_;
          pfVar2[7] = auVar5._28_4_ + auVar9._28_4_;
          lVar17 = lVar17 + 0x20;
        } while ((ulong)uVar6 << 5 != lVar17);
      }
    }
  }
  else {
    if (iVar14 != 3) {
      iVar14 = PReLU::forward_inplace
                         ((PReLU *)((long)&this->_vptr_PReLU_x86_avx +
                                   (long)this->_vptr_PReLU_x86_avx[-3]),bottom_top_blob,opt);
      return iVar14;
    }
    iVar14 = bottom_top_blob->c;
    if (0 < (long)iVar14) {
      lVar17 = *(long *)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx[-3]);
      uVar16 = bottom_top_blob->h * bottom_top_blob->w;
      pp_Var8 = this->_vptr_PReLU_x86_avx;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = (ulong)(uVar16 & 7) - 1;
      auVar23 = vpshufd_avx(auVar23,0x44);
      auVar25 = ZEXT816(0);
      uVar11 = auVar23._0_8_;
      auVar37._0_8_ = uVar11 ^ 0x8000000000000000;
      auVar37._8_4_ = auVar23._8_4_;
      uVar6 = auVar23._12_4_;
      auVar37._12_4_ = uVar6 ^ 0x80000000;
      auVar23 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
      auVar38._8_4_ = 0xffff;
      auVar38._0_8_ = 0xffff0000ffff;
      auVar38._12_4_ = 0xffff;
      auVar38._16_4_ = 0xffff;
      auVar38._20_4_ = 0xffff;
      auVar38._24_4_ = 0xffff;
      auVar38._28_4_ = 0xffff;
      uVar22 = 0;
      do {
        pauVar18 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar21 = uVar22 & 0xffffffff;
        if (*(int *)(&this->field_0xd0 + (long)pp_Var8[-3]) < 2) {
          uVar21 = 0;
        }
        uVar3 = *(uint *)(lVar17 + uVar21 * 4);
        if (0 < (int)uVar16 >> 3) {
          auVar31 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
          iVar15 = ((int)uVar16 >> 3) + 1;
          do {
            auVar10 = vmaxps_avx(*pauVar18,ZEXT1632(auVar25));
            auVar40 = vminps_avx(*pauVar18,ZEXT1632(auVar25));
            auVar43._0_4_ = auVar40._0_4_ * auVar31._0_4_ + auVar10._0_4_;
            auVar43._4_4_ = auVar40._4_4_ * auVar31._4_4_ + auVar10._4_4_;
            auVar43._8_4_ = auVar40._8_4_ * auVar31._8_4_ + auVar10._8_4_;
            auVar43._12_4_ = auVar40._12_4_ * auVar31._12_4_ + auVar10._12_4_;
            auVar43._16_4_ = auVar40._16_4_ * auVar31._0_4_ + auVar10._16_4_;
            auVar43._20_4_ = auVar40._20_4_ * auVar31._4_4_ + auVar10._20_4_;
            auVar43._24_4_ = auVar40._24_4_ * auVar31._8_4_ + auVar10._24_4_;
            auVar43._28_4_ = auVar40._28_4_ + auVar10._28_4_;
            *pauVar18 = auVar43;
            pauVar18 = pauVar18 + 1;
            iVar15 = iVar15 + -1;
          } while (1 < iVar15);
        }
        if ((uVar16 & 7) != 0) {
          auVar31 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
          uVar21 = 0;
          do {
            auVar39._8_8_ = 0;
            auVar39._0_8_ = uVar21;
            auVar39 = vpshufd_avx(auVar39,0x44);
            auVar40._16_16_ = auVar39;
            auVar40._0_16_ = auVar39;
            auVar10 = vorps_avx(auVar40,auVar5);
            auVar40 = vorps_avx(auVar40,auVar9);
            auVar45._0_8_ = auVar40._16_8_ ^ 0x8000000000000000;
            auVar45._8_4_ = auVar40._24_4_;
            auVar45._12_4_ = auVar40._28_4_ ^ 0x80000000;
            auVar39 = vpcmpgtq_avx(auVar45,auVar37);
            auVar48._0_8_ = uVar11 ^ 0x8000000000000000;
            auVar48._8_4_ = auVar37._8_4_;
            auVar48._12_4_ = uVar6 ^ 0x80000000;
            auVar47._0_8_ = auVar40._0_8_ ^ 0x8000000000000000;
            auVar47._8_4_ = auVar40._8_4_;
            auVar47._12_4_ = auVar40._12_4_ ^ 0x80000000;
            auVar47 = vpcmpgtq_avx(auVar47,auVar48);
            auVar39 = vpackssdw_avx(auVar47,auVar39);
            auVar46._0_8_ = auVar10._16_8_ ^ 0x8000000000000000;
            auVar46._8_4_ = auVar10._24_4_;
            auVar46._12_4_ = auVar10._28_4_ ^ 0x80000000;
            auVar47 = vpcmpgtq_avx(auVar46,auVar37);
            auVar49._0_8_ = uVar11 ^ 0x8000000000000000;
            auVar49._8_4_ = auVar37._8_4_;
            auVar49._12_4_ = uVar6 ^ 0x80000000;
            auVar42._0_8_ = auVar10._0_8_ ^ 0x8000000000000000;
            auVar42._8_4_ = auVar10._8_4_;
            auVar42._12_4_ = auVar10._12_4_ ^ 0x80000000;
            auVar42 = vpcmpgtq_avx(auVar42,auVar49);
            auVar47 = vpackssdw_avx(auVar42,auVar47);
            auVar39 = vpackssdw_avx(auVar47 ^ auVar23,auVar39 ^ auVar23);
            auVar47 = vpmovsxwd_avx(auVar39);
            auVar42 = vpunpckhwd_avx(auVar39,auVar39);
            auVar44._16_16_ = auVar42;
            auVar44._0_16_ = auVar47;
            auVar40 = vmaskmovps_avx(auVar44,*(undefined1 (*) [32])(*pauVar18 + uVar21 * 4));
            auVar10 = vcmpps_avx(auVar40,ZEXT1632(auVar25),1);
            auVar10 = vandps_avx(auVar10,auVar38);
            auVar47 = vpackusdw_avx(auVar10._0_16_,auVar10._16_16_);
            auVar39 = vpand_avx(auVar39,auVar47);
            auVar47 = vpmovzxwd_avx(auVar39);
            auVar47 = vpslld_avx(auVar47,0x1f);
            auVar39 = vpunpckhwd_avx(auVar39,auVar39);
            auVar39 = vpslld_avx(auVar39,0x1f);
            auVar41._16_16_ = auVar39;
            auVar41._0_16_ = auVar47;
            auVar10._4_4_ = auVar40._4_4_ * auVar31._4_4_;
            auVar10._0_4_ = auVar40._0_4_ * auVar31._0_4_;
            auVar10._8_4_ = auVar40._8_4_ * auVar31._8_4_;
            auVar10._12_4_ = auVar40._12_4_ * auVar31._12_4_;
            auVar10._16_4_ = auVar40._16_4_ * auVar31._0_4_;
            auVar10._20_4_ = auVar40._20_4_ * auVar31._4_4_;
            auVar10._24_4_ = auVar40._24_4_ * auVar31._8_4_;
            auVar10._28_4_ = auVar40._28_4_;
            auVar10 = vmaskmovps_avx(auVar41,auVar10);
            *(undefined1 (*) [32])(*pauVar18 + uVar21 * 4) = auVar10;
            uVar21 = uVar21 + 8;
          } while (((uVar16 & 7) + 7 & 0xfffffff8) != uVar21);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != (long)iVar14);
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _slope = _mm256_loadu_ps(slope + i * 8);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
            else
            {
                __m256 _slope = _mm256_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _slope = _mm_loadu_ps(slope + i * 4);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
            else
            {
                __m128 _slope = _mm_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return PReLU::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    const float* slope_data_ptr = slope_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        float slope = num_slope > 1 ? slope_data_ptr[q] : slope_data_ptr[0];

#if __AVX__
        int nn = size >> 3;
        int remain = size - (nn << 3);
#else
        int remain = size;
#endif // __AVX__

#if __AVX__
        for (; nn > 0; nn--)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, prelu_avx(_p, _mm256_set1_ps(slope)));
            ptr += 8;
        }
#endif // __AVX__
        for (; remain > 0; remain--)
        {
            if (*ptr < 0)
                *ptr *= slope;

            ptr++;
        }
    }

    return 0;
}